

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_set_timeouts(tftp_state_data *state)

{
  Curl_easy *data;
  curl_trc_feat *pcVar1;
  int iVar2;
  int iVar3;
  timediff_t tVar4;
  ulong uVar5;
  time_t tVar6;
  CURLcode CVar7;
  
  tVar4 = Curl_timeleft(state->data,(curltime *)0x0,state->state == TFTP_STATE_START);
  if (tVar4 < 0) {
    Curl_failf(state->data,"Connection time-out");
    CVar7 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (tVar4 == 0) {
      uVar5 = 0xe10;
    }
    else {
      uVar5 = (tVar4 + 500U) / 1000;
    }
    iVar3 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 5);
    iVar2 = 0x32;
    if (iVar3 < 0x32) {
      iVar2 = iVar3;
    }
    iVar3 = 3;
    if (0xe < (int)uVar5) {
      iVar3 = iVar2;
    }
    state->retry_max = iVar3;
    iVar3 = (int)((long)uVar5 / (long)iVar3);
    iVar2 = 1;
    if (1 < iVar3) {
      iVar2 = iVar3;
    }
    state->retry_time = iVar2;
    data = state->data;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      Curl_infof(data,"set timeouts for state %d; Total % ld, retry %d maxtry %d",
                 (ulong)state->state);
    }
    CVar7 = CURLE_OK;
    tVar6 = time((time_t *)0x0);
    state->rx_time = tVar6;
  }
  return CVar7;
}

Assistant:

static CURLcode tftp_set_timeouts(struct tftp_state_data *state)
{
  time_t maxtime, timeout;
  timediff_t timeout_ms;
  bool start = (state->state == TFTP_STATE_START);

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(timeout_ms > 0)
    maxtime = (time_t)(timeout_ms + 500) / 1000;
  else
    maxtime = 3600; /* use for calculating block timeouts */

  /* Set per-block timeout to total */
  timeout = maxtime;

  /* Average reposting an ACK after 5 seconds */
  state->retry_max = (int)timeout/5;

  /* But bound the total number */
  if(state->retry_max < 3)
    state->retry_max = 3;

  if(state->retry_max > 50)
    state->retry_max = 50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time < 1)
    state->retry_time = 1;

  infof(state->data,
        "set timeouts for state %d; Total % " FMT_OFF_T ", retry %d maxtry %d",
        (int)state->state, timeout_ms, state->retry_time, state->retry_max);

  /* init RX time */
  state->rx_time = time(NULL);

  return CURLE_OK;
}